

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ManGenCnf(word uTruth,int iLitOut,Vec_Int_t *vLeaves,Vec_Int_t *vLits,Vec_Int_t *vClas,
                 Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  uint Entry;
  bool bVar5;
  ulong local_58;
  uint local_50;
  uint local_4c;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  long local_38;
  
  local_58 = uTruth;
  if (1 < uTruth + 1) {
    if (vLeaves->nSize < 1) {
      __assert_fail("Vec_IntSize(vLeaves) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                    ,0x8a,
                    "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    local_50 = iLitOut;
    local_48 = vCover;
    local_40 = vClas;
    iVar1 = 0;
    do {
      iVar2 = Kit_TruthIsop((uint *)&local_58,vLeaves->nSize,vCover,0);
      if (iVar2 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                      ,0x8e,
                      "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (0 < vCover->nSize) {
        local_4c = (uint)(iVar1 == 1) ^ iLitOut;
        lVar3 = 0;
        do {
          iVar2 = vCover->pArray[lVar3];
          local_38 = lVar3;
          Vec_IntPush(vClas,vLits->nSize);
          if (iLitOut < 0) goto LAB_006fdebd;
          Vec_IntPush(vLits,local_4c);
          if (0 < vLeaves->nSize) {
            bVar4 = 0;
            lVar3 = 0;
            do {
              switch(iVar2 >> (bVar4 & 0x1f) & 3) {
              case 0:
                goto switchD_006fde38_caseD_0;
              case 1:
                Entry = vLeaves->pArray[lVar3];
                if ((int)Entry < 0) goto LAB_006fdebd;
                break;
              case 2:
                if (vLeaves->pArray[lVar3] < 0) goto LAB_006fdebd;
                Entry = vLeaves->pArray[lVar3] ^ 1;
                break;
              case 3:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                              ,0x9b,
                              "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              Vec_IntPush(vLits,Entry);
switchD_006fde38_caseD_0:
              lVar3 = lVar3 + 1;
              bVar4 = bVar4 + 2;
            } while (lVar3 < vLeaves->nSize);
          }
          lVar3 = local_38 + 1;
          vClas = local_40;
          vCover = local_48;
          iLitOut = local_50;
        } while (lVar3 < local_48->nSize);
      }
      local_58 = ~local_58;
      bVar5 = iVar1 != 0;
      iVar1 = iVar1 + 1;
      if (bVar5) {
        return;
      }
    } while( true );
  }
  Vec_IntPush(vClas,vLits->nSize);
  if (-1 < iLitOut) {
    Vec_IntPush(vLits,(uint)(local_58 == 0) ^ iLitOut);
    return;
  }
LAB_006fdebd:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf5,"int Abc_LitNotCond(int, int)");
}

Assistant:

void Jf_ManGenCnf( word uTruth, int iLitOut, Vec_Int_t * vLeaves, Vec_Int_t * vLits, Vec_Int_t * vClas, Vec_Int_t * vCover )
{
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Vec_IntPush( vLits, Abc_LitNotCond(iLitOut, (uTruth == 0)) );
    }
    else 
    {
        int i, k, c, Literal, Cube;
        assert( Vec_IntSize(vLeaves) > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, Vec_IntSize(vLeaves), vCover, 0 );
            assert( RetValue == 0 );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                Vec_IntPush( vClas, Vec_IntSize(vLits) );
                Vec_IntPush( vLits, Abc_LitNotCond(iLitOut, c) );
                for ( k = 0; k < Vec_IntSize(vLeaves); k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_IntPush( vLits, Abc_LitNotCond(Vec_IntEntry(vLeaves, k), 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_IntPush( vLits, Abc_LitNotCond(Vec_IntEntry(vLeaves, k), 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
            }
            uTruth = ~uTruth;
        }
    }
}